

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossibleDataType(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,kind) - 0x116;
  if ((((0x3f < uVar1) || ((0x8001809400400881U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
      ((uVar1 = CONCAT22(in_register_0000003a,kind) - 0xc5, 0x3c < uVar1 ||
       ((0x160000000000c003U >> ((ulong)uVar1 & 0x3f) & 1) == 0)))) &&
     ((((uVar1 = CONCAT22(in_register_0000003a,kind) - 0x6d, 0x35 < uVar1 ||
        ((0x30000000010421U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
       (1 < CONCAT22(in_register_0000003a,kind) - 0x113U)) &&
      ((CONCAT22(in_register_0000003a,kind) != 2 && (CONCAT22(in_register_0000003a,kind) != 0xf)))))
     ) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleDataType(TokenKind kind) {
    switch (kind) {
        case TokenKind::BitKeyword:
        case TokenKind::LogicKeyword:
        case TokenKind::RegKeyword:
        case TokenKind::ByteKeyword:
        case TokenKind::ShortIntKeyword:
        case TokenKind::IntKeyword:
        case TokenKind::LongIntKeyword:
        case TokenKind::IntegerKeyword:
        case TokenKind::TimeKeyword:
        case TokenKind::ShortRealKeyword:
        case TokenKind::RealKeyword:
        case TokenKind::RealTimeKeyword:
        case TokenKind::StringKeyword:
        case TokenKind::ConstKeyword:
        case TokenKind::SignedKeyword:
        case TokenKind::UnsignedKeyword:
        case TokenKind::StructKeyword:
        case TokenKind::UnionKeyword:
        case TokenKind::EnumKeyword:
        case TokenKind::CHandleKeyword:
        case TokenKind::VirtualKeyword:
        case TokenKind::EventKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::VoidKeyword:
        case TokenKind::Identifier:
        case TokenKind::UnitSystemName:
        case TokenKind::OpenBracket:
            return true;
        default:
            return false;
    }
}